

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_message.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::java::ImmutableMessageGenerator::GenerateInterface
          (ImmutableMessageGenerator *this,Printer *printer)

{
  Descriptor *descriptor;
  Context *context;
  Printer *pPVar1;
  bool bVar2;
  int iVar3;
  MessageOptions *pMVar4;
  string *psVar5;
  FieldDescriptor *field;
  ImmutableFieldGenerator *pIVar6;
  set<const_google::protobuf::OneofDescriptor_*,_std::less<const_google::protobuf::OneofDescriptor_*>,_std::allocator<const_google::protobuf::OneofDescriptor_*>_>
  *this_00;
  reference ppOVar7;
  OneofGeneratorInfo *pOVar8;
  ClassNameResolver *this_01;
  string local_108;
  OneofDescriptor *local_e8;
  OneofDescriptor *oneof;
  iterator __end3;
  iterator __begin3;
  set<const_google::protobuf::OneofDescriptor_*,_std::less<const_google::protobuf::OneofDescriptor_*>,_std::allocator<const_google::protobuf::OneofDescriptor_*>_>
  *__range3;
  undefined1 local_c0 [4];
  int i;
  char *local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  string local_78;
  char *local_58 [3];
  allocator local_39;
  string local_38;
  Printer *local_18;
  Printer *printer_local;
  ImmutableMessageGenerator *this_local;
  
  descriptor = (this->super_MessageGenerator).descriptor_;
  context = this->context_;
  local_18 = printer;
  printer_local = (Printer *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_38,"OrBuilder",&local_39);
  MaybePrintGeneratedAnnotation<google::protobuf::Descriptor_const>
            (context,printer,descriptor,true,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  iVar3 = Descriptor::extension_range_count((this->super_MessageGenerator).descriptor_);
  pPVar1 = local_18;
  if (iVar3 < 1) {
    pMVar4 = Descriptor::options((this->super_MessageGenerator).descriptor_);
    bVar2 = MessageOptions::deprecated(pMVar4);
    local_a0 = "";
    if (bVar2) {
      local_a0 = "@java.lang.Deprecated ";
    }
    ExtraMessageOrBuilderInterfaces_abi_cxx11_
              ((string *)local_c0,(java *)(this->super_MessageGenerator).descriptor_,
               (Descriptor *)"@java.lang.Deprecated ");
    psVar5 = Descriptor::name_abi_cxx11_((this->super_MessageGenerator).descriptor_);
    io::Printer::
    Print<char[12],char_const*,char[17],std::__cxx11::string,char[10],std::__cxx11::string,char[2],char[1],char[2],char[1]>
              (pPVar1,
               "$deprecation$public interface ${$$classname$OrBuilder$}$ extends\n    $extra_interfaces$\n    com.google.protobuf.MessageOrBuilder {\n"
               ,(char (*) [12])0x7acf6f,&local_a0,(char (*) [17])"extra_interfaces",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c0,
               (char (*) [10])0x77c586,psVar5,(char (*) [2])0x7c8ddc,(char (*) [1])0x76a5a1,
               (char (*) [2])0x7b3f12,(char (*) [1])0x76a5a1);
    std::__cxx11::string::~string((string *)local_c0);
  }
  else {
    pMVar4 = Descriptor::options((this->super_MessageGenerator).descriptor_);
    bVar2 = MessageOptions::deprecated(pMVar4);
    local_58[0] = "";
    if (bVar2) {
      local_58[0] = "@java.lang.Deprecated ";
    }
    ExtraMessageOrBuilderInterfaces_abi_cxx11_
              (&local_78,(java *)(this->super_MessageGenerator).descriptor_,
               (Descriptor *)"@java.lang.Deprecated ");
    psVar5 = Descriptor::name_abi_cxx11_((this->super_MessageGenerator).descriptor_);
    GeneratedCodeVersionSuffix_abi_cxx11_();
    io::Printer::
    Print<char[12],char_const*,char[17],std::__cxx11::string,char[10],std::__cxx11::string,char[2],char[1],char[2],char[1],char[4],std::__cxx11::string>
              (pPVar1,
               "$deprecation$public interface ${$$classname$OrBuilder$}$ extends\n    $extra_interfaces$\n    com.google.protobuf.GeneratedMessage$ver$.\n        ExtendableMessageOrBuilder<$classname$> {\n"
               ,(char (*) [12])0x7acf6f,local_58,(char (*) [17])"extra_interfaces",&local_78,
               (char (*) [10])0x77c586,psVar5,(char (*) [2])0x7c8ddc,(char (*) [1])0x76a5a1,
               (char (*) [2])0x7b3f12,(char (*) [1])0x76a5a1,(char (*) [4])0x76cf09,&local_98);
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::~string((string *)&local_78);
  }
  io::Printer::Annotate<google::protobuf::Descriptor>
            (local_18,"{","}",(this->super_MessageGenerator).descriptor_);
  io::Printer::Indent(local_18);
  __range3._4_4_ = 0;
  while( true ) {
    iVar3 = Descriptor::field_count((this->super_MessageGenerator).descriptor_);
    if (iVar3 <= __range3._4_4_) break;
    io::Printer::Print<>(local_18,"\n");
    field = Descriptor::field((this->super_MessageGenerator).descriptor_,__range3._4_4_);
    pIVar6 = FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldGenerator>::get
                       (&this->field_generators_,field);
    (*pIVar6->_vptr_ImmutableFieldGenerator[4])(pIVar6,local_18);
    __range3._4_4_ = __range3._4_4_ + 1;
  }
  this_00 = &(this->super_MessageGenerator).oneofs_;
  __end3 = std::
           set<const_google::protobuf::OneofDescriptor_*,_std::less<const_google::protobuf::OneofDescriptor_*>,_std::allocator<const_google::protobuf::OneofDescriptor_*>_>
           ::begin(this_00);
  oneof = (OneofDescriptor *)
          std::
          set<const_google::protobuf::OneofDescriptor_*,_std::less<const_google::protobuf::OneofDescriptor_*>,_std::allocator<const_google::protobuf::OneofDescriptor_*>_>
          ::end(this_00);
  while( true ) {
    bVar2 = std::operator!=(&__end3,(_Self *)&oneof);
    if (!bVar2) break;
    ppOVar7 = std::_Rb_tree_const_iterator<const_google::protobuf::OneofDescriptor_*>::operator*
                        (&__end3);
    pPVar1 = local_18;
    local_e8 = *ppOVar7;
    pOVar8 = Context::GetOneofGeneratorInfo(this->context_,local_e8);
    this_01 = Context::GetNameResolver(this->context_);
    ClassNameResolver::GetImmutableClassName<google::protobuf::Descriptor>
              (&local_108,this_01,(this->super_MessageGenerator).descriptor_);
    io::Printer::Print<char[23],std::__cxx11::string,char[10],std::__cxx11::string>
              (pPVar1,
               "\npublic $classname$.$oneof_capitalized_name$Case get$oneof_capitalized_name$Case();\n"
               ,(char (*) [23])"oneof_capitalized_name",&pOVar8->capitalized_name,
               (char (*) [10])0x77c586,&local_108);
    std::__cxx11::string::~string((string *)&local_108);
    std::_Rb_tree_const_iterator<const_google::protobuf::OneofDescriptor_*>::operator++(&__end3);
  }
  io::Printer::Outdent(local_18);
  io::Printer::Print<>(local_18,"}\n");
  return;
}

Assistant:

void ImmutableMessageGenerator::GenerateInterface(io::Printer* printer) {
  MaybePrintGeneratedAnnotation(context_, printer, descriptor_,
                                /* immutable = */ true, "OrBuilder");
  if (descriptor_->extension_range_count() > 0) {
    printer->Print(
        "$deprecation$public interface ${$$classname$OrBuilder$}$ extends\n"
        "    $extra_interfaces$\n"
        "    com.google.protobuf.GeneratedMessage$ver$.\n"
        "        ExtendableMessageOrBuilder<$classname$> {\n",
        "deprecation",
        descriptor_->options().deprecated() ? "@java.lang.Deprecated " : "",
        "extra_interfaces", ExtraMessageOrBuilderInterfaces(descriptor_),
        "classname", descriptor_->name(), "{", "", "}", "", "ver",
        GeneratedCodeVersionSuffix());
  } else {
    printer->Print(
        "$deprecation$public interface ${$$classname$OrBuilder$}$ extends\n"
        "    $extra_interfaces$\n"
        "    com.google.protobuf.MessageOrBuilder {\n",
        "deprecation",
        descriptor_->options().deprecated() ? "@java.lang.Deprecated " : "",
        "extra_interfaces", ExtraMessageOrBuilderInterfaces(descriptor_),
        "classname", descriptor_->name(), "{", "", "}", "");
  }
  printer->Annotate("{", "}", descriptor_);

  printer->Indent();
  for (int i = 0; i < descriptor_->field_count(); i++) {
    printer->Print("\n");
    field_generators_.get(descriptor_->field(i))
        .GenerateInterfaceMembers(printer);
  }
  for (auto oneof : oneofs_) {
    printer->Print(
        "\n"
        "public $classname$.$oneof_capitalized_name$Case "
        "get$oneof_capitalized_name$Case();\n",
        "oneof_capitalized_name",
        context_->GetOneofGeneratorInfo(oneof)->capitalized_name, "classname",
        context_->GetNameResolver()->GetImmutableClassName(descriptor_));
  }
  printer->Outdent();

  printer->Print("}\n");
}